

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_sint.hpp
# Opt level: O1

ans_sint_encode<160U> *
ans_sint_encode<160U>::create
          (ans_sint_encode<160U> *__return_storage_ptr__,uint32_t *in_u32,size_t n)

{
  uint32_t uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer peVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  byte bVar9;
  byte bVar10;
  uint64_t uVar11;
  ulong uVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  ushort uVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  uint largest_sym;
  undefined1 auVar24 [64];
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  allocator_type local_59;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_40;
  
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nfreqs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->table).
  super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (n == 0) {
    largest_sym = 0;
  }
  else {
    auVar18 = vpbroadcastq_avx512f();
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    uVar12 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar24);
      auVar24 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar24,auVar19);
      auVar24 = vporq_avx512f(auVar24,auVar20);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar18,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar22,auVar18,2);
      bVar10 = (byte)uVar8;
      uVar16 = CONCAT11(bVar10,bVar9);
      auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])(in_u32 + uVar12));
      auVar22._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar24._4_4_;
      auVar22._0_4_ = (uint)(bVar9 & 1) * auVar24._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar24._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar24._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar24._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar24._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar24._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar24._28_4_;
      auVar22._32_4_ = (uint)(bVar10 & 1) * auVar24._32_4_;
      auVar22._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar24._36_4_;
      auVar22._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar24._40_4_;
      auVar22._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar24._44_4_;
      auVar22._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar24._48_4_;
      auVar22._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar24._52_4_;
      auVar22._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar24._56_4_;
      auVar22._60_4_ = (uint)(bVar10 >> 7) * auVar24._60_4_;
      auVar24 = vpmaxud_avx512f(auVar22,auVar21);
      uVar12 = uVar12 + 0x10;
    } while ((n + 0xf & 0xfffffffffffffff0) != uVar12);
    auVar18 = vmovdqa32_avx512f(auVar24);
    auVar19._0_4_ = (uint)(bVar9 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar21._0_4_;
    bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar19._4_4_ = (uint)bVar5 * auVar18._4_4_ | (uint)!bVar5 * auVar21._4_4_;
    bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar19._8_4_ = (uint)bVar5 * auVar18._8_4_ | (uint)!bVar5 * auVar21._8_4_;
    bVar5 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar19._12_4_ = (uint)bVar5 * auVar18._12_4_ | (uint)!bVar5 * auVar21._12_4_;
    bVar5 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar19._16_4_ = (uint)bVar5 * auVar18._16_4_ | (uint)!bVar5 * auVar21._16_4_;
    bVar5 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar19._20_4_ = (uint)bVar5 * auVar18._20_4_ | (uint)!bVar5 * auVar21._20_4_;
    bVar5 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar19._24_4_ = (uint)bVar5 * auVar18._24_4_ | (uint)!bVar5 * auVar21._24_4_;
    bVar5 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar19._28_4_ = (uint)bVar5 * auVar18._28_4_ | (uint)!bVar5 * auVar21._28_4_;
    auVar19._32_4_ =
         (uint)(bVar10 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar21._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar19._36_4_ = (uint)bVar5 * auVar18._36_4_ | (uint)!bVar5 * auVar21._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar19._40_4_ = (uint)bVar5 * auVar18._40_4_ | (uint)!bVar5 * auVar21._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar19._44_4_ = (uint)bVar5 * auVar18._44_4_ | (uint)!bVar5 * auVar21._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar19._48_4_ = (uint)bVar5 * auVar18._48_4_ | (uint)!bVar5 * auVar21._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar19._52_4_ = (uint)bVar5 * auVar18._52_4_ | (uint)!bVar5 * auVar21._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar19._56_4_ = (uint)bVar5 * auVar18._56_4_ | (uint)!bVar5 * auVar21._56_4_;
    auVar19._60_4_ =
         (uint)(bVar10 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar21._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar19,1);
    auVar18 = vpmaxud_avx512f(auVar19,ZEXT3264(auVar17));
    auVar6 = vpmaxud_avx(auVar18._0_16_,auVar18._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpmaxud_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpmaxud_avx(auVar6,auVar7);
    largest_sym = auVar6._0_4_;
  }
  local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,(ulong)(largest_sym + 1),(value_type_conflict2 *)&local_40,&local_59);
  if (n != 0) {
    sVar13 = 0;
    do {
      local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[in_u32[sVar13]] =
           local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start[in_u32[sVar13]] + 1;
      sVar13 = sVar13 + 1;
    } while (n != sVar13);
  }
  adjust_freqs(&local_40,&local_58,largest_sym,false,0xa0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&__return_storage_ptr__->nfreqs,&local_40);
  if (local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar3) {
    uVar11 = 0;
  }
  else {
    auVar18 = vpbroadcastq_avx512f();
    auVar18 = vpsrlq_avx512f(auVar18,2);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    uVar12 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar24);
      auVar24 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar24,auVar19);
      auVar24 = vporq_avx512f(auVar24,auVar20);
      uVar8 = vpcmpuq_avx512f(auVar24,auVar18,2);
      bVar9 = (byte)uVar8;
      uVar8 = vpcmpuq_avx512f(auVar22,auVar18,2);
      bVar10 = (byte)uVar8;
      uVar16 = CONCAT11(bVar10,bVar9);
      auVar24 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar2 + uVar12));
      auVar23._4_4_ = (uint)((byte)(uVar16 >> 1) & 1) * auVar24._4_4_;
      auVar23._0_4_ = (uint)(bVar9 & 1) * auVar24._0_4_;
      auVar23._8_4_ = (uint)((byte)(uVar16 >> 2) & 1) * auVar24._8_4_;
      auVar23._12_4_ = (uint)((byte)(uVar16 >> 3) & 1) * auVar24._12_4_;
      auVar23._16_4_ = (uint)((byte)(uVar16 >> 4) & 1) * auVar24._16_4_;
      auVar23._20_4_ = (uint)((byte)(uVar16 >> 5) & 1) * auVar24._20_4_;
      auVar23._24_4_ = (uint)((byte)(uVar16 >> 6) & 1) * auVar24._24_4_;
      auVar23._28_4_ = (uint)((byte)(uVar16 >> 7) & 1) * auVar24._28_4_;
      auVar23._32_4_ = (uint)(bVar10 & 1) * auVar24._32_4_;
      auVar23._36_4_ = (uint)(bVar10 >> 1 & 1) * auVar24._36_4_;
      auVar23._40_4_ = (uint)(bVar10 >> 2 & 1) * auVar24._40_4_;
      auVar23._44_4_ = (uint)(bVar10 >> 3 & 1) * auVar24._44_4_;
      auVar23._48_4_ = (uint)(bVar10 >> 4 & 1) * auVar24._48_4_;
      auVar23._52_4_ = (uint)(bVar10 >> 5 & 1) * auVar24._52_4_;
      auVar23._56_4_ = (uint)(bVar10 >> 6 & 1) * auVar24._56_4_;
      auVar23._60_4_ = (uint)(bVar10 >> 7) * auVar24._60_4_;
      auVar24 = vpaddd_avx512f(auVar23,auVar21);
      uVar12 = uVar12 + 0x10;
    } while ((((ulong)((long)puVar3 + (-4 - (long)puVar2)) >> 2) + 0x10 & 0xfffffffffffffff0) !=
             uVar12);
    auVar18 = vmovdqa32_avx512f(auVar24);
    auVar20._0_4_ = (uint)(bVar9 & 1) * auVar18._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar21._0_4_;
    bVar5 = (bool)((byte)(uVar16 >> 1) & 1);
    auVar20._4_4_ = (uint)bVar5 * auVar18._4_4_ | (uint)!bVar5 * auVar21._4_4_;
    bVar5 = (bool)((byte)(uVar16 >> 2) & 1);
    auVar20._8_4_ = (uint)bVar5 * auVar18._8_4_ | (uint)!bVar5 * auVar21._8_4_;
    bVar5 = (bool)((byte)(uVar16 >> 3) & 1);
    auVar20._12_4_ = (uint)bVar5 * auVar18._12_4_ | (uint)!bVar5 * auVar21._12_4_;
    bVar5 = (bool)((byte)(uVar16 >> 4) & 1);
    auVar20._16_4_ = (uint)bVar5 * auVar18._16_4_ | (uint)!bVar5 * auVar21._16_4_;
    bVar5 = (bool)((byte)(uVar16 >> 5) & 1);
    auVar20._20_4_ = (uint)bVar5 * auVar18._20_4_ | (uint)!bVar5 * auVar21._20_4_;
    bVar5 = (bool)((byte)(uVar16 >> 6) & 1);
    auVar20._24_4_ = (uint)bVar5 * auVar18._24_4_ | (uint)!bVar5 * auVar21._24_4_;
    bVar5 = (bool)((byte)(uVar16 >> 7) & 1);
    auVar20._28_4_ = (uint)bVar5 * auVar18._28_4_ | (uint)!bVar5 * auVar21._28_4_;
    auVar20._32_4_ =
         (uint)(bVar10 & 1) * auVar18._32_4_ | (uint)!(bool)(bVar10 & 1) * auVar21._32_4_;
    bVar5 = (bool)(bVar10 >> 1 & 1);
    auVar20._36_4_ = (uint)bVar5 * auVar18._36_4_ | (uint)!bVar5 * auVar21._36_4_;
    bVar5 = (bool)(bVar10 >> 2 & 1);
    auVar20._40_4_ = (uint)bVar5 * auVar18._40_4_ | (uint)!bVar5 * auVar21._40_4_;
    bVar5 = (bool)(bVar10 >> 3 & 1);
    auVar20._44_4_ = (uint)bVar5 * auVar18._44_4_ | (uint)!bVar5 * auVar21._44_4_;
    bVar5 = (bool)(bVar10 >> 4 & 1);
    auVar20._48_4_ = (uint)bVar5 * auVar18._48_4_ | (uint)!bVar5 * auVar21._48_4_;
    bVar5 = (bool)(bVar10 >> 5 & 1);
    auVar20._52_4_ = (uint)bVar5 * auVar18._52_4_ | (uint)!bVar5 * auVar21._52_4_;
    bVar5 = (bool)(bVar10 >> 6 & 1);
    auVar20._56_4_ = (uint)bVar5 * auVar18._56_4_ | (uint)!bVar5 * auVar21._56_4_;
    auVar20._60_4_ =
         (uint)(bVar10 >> 7) * auVar18._60_4_ | (uint)!(bool)(bVar10 >> 7) * auVar21._60_4_;
    auVar17 = vextracti64x4_avx512f(auVar20,1);
    auVar18 = vpaddd_avx512f(auVar20,ZEXT3264(auVar17));
    auVar6 = vpaddd_avx(auVar18._0_16_,auVar18._16_16_);
    auVar7 = vpshufd_avx(auVar6,0xee);
    auVar6 = vpaddd_avx(auVar6,auVar7);
    auVar7 = vpshufd_avx(auVar6,0x55);
    auVar6 = vpaddd_avx(auVar6,auVar7);
    uVar11 = (uint64_t)auVar6._0_4_;
  }
  __return_storage_ptr__->frame_size = uVar11;
  std::vector<enc_entry_sint,_std::allocator<enc_entry_sint>_>::resize
            (&__return_storage_ptr__->table,(ulong)(largest_sym + 1));
  puVar2 = (__return_storage_ptr__->nfreqs).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  peVar4 = (__return_storage_ptr__->table).
           super__Vector_base<enc_entry_sint,_std::allocator<enc_entry_sint>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar14 = 0;
  lVar15 = 0;
  do {
    uVar1 = *(uint32_t *)((long)puVar2 + lVar14);
    if (uVar1 != 0) {
      (&peVar4->freq)[lVar14] = uVar1;
      (&peVar4->base)[lVar14] = (uint32_t)lVar15;
      uVar12 = (ulong)*(uint *)((long)puVar2 + lVar14);
      lVar15 = lVar15 + uVar12;
      *(ulong *)((long)&peVar4->sym_upper_bound + lVar14 * 4) = uVar12 << 0x24;
    }
    lVar14 = lVar14 + 4;
  } while ((ulong)largest_sym * 4 + 4 != lVar14);
  __return_storage_ptr__->lower_bound = __return_storage_ptr__->frame_size << 4;
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static ans_sint_encode create(const uint32_t* in_u32, size_t n)
    {
        ans_sint_encode model;
        uint32_t max_sym = 0;
        for (size_t i = 0; i < n; i++) {
            max_sym = std::max(in_u32[i], max_sym);
        }
        std::vector<uint64_t> freqs(max_sym + 1, 0);
        for (size_t i = 0; i < n; i++) {
            freqs[in_u32[i]]++;
        }
        model.nfreqs = adjust_freqs(freqs, max_sym, false, H_approx);
        model.frame_size = std::accumulate(
            std::begin(model.nfreqs), std::end(model.nfreqs), 0);
        uint64_t cur_base = 0;
        uint64_t tmp = constants::K * constants::RADIX;

        model.table.resize(max_sym + 1);
        for (size_t sym = 0; sym <= max_sym; sym++) {
            if (model.nfreqs[sym] == 0)
                continue;
            model.table[sym].freq = model.nfreqs[sym];
            model.table[sym].base = cur_base;
            model.table[sym].sym_upper_bound = tmp * model.nfreqs[sym];
            cur_base += model.nfreqs[sym];
        }
        model.lower_bound = constants::K * model.frame_size;
        return model;
    }